

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner2.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::IGXMLScanner::normalizeAttRawValue
          (IGXMLScanner *this,XMLCh *attrName,XMLCh *value,XMLBuffer *toFill)

{
  XMLCh *pXVar1;
  XMLSize_t XVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLCh XVar5;
  bool bVar6;
  
  toFill->fIndex = 0;
  XVar5 = *value;
  if (XVar5 == L'\0') {
    bVar6 = true;
  }
  else {
    bVar6 = true;
    do {
      if (XVar5 == L'\xffff') {
        pXVar1 = value + 1;
        value = value + 1;
        XVar3 = *pXVar1;
      }
      else {
        XVar3 = XVar5;
        if (*value == L'<') {
          bVar6 = false;
          XMLScanner::emitError
                    (&this->super_XMLScanner,BracketInAttrValue,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0);
        }
      }
      XVar4 = XVar3;
      if ((XVar5 != L'\xffff') &&
         (XVar4 = L' ',
         -1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                    [(ushort)XVar3])) {
        XVar4 = XVar3;
      }
      if (toFill->fIndex == toFill->fCapacity) {
        XMLBuffer::ensureCapacity(toFill,1);
      }
      XVar2 = toFill->fIndex;
      toFill->fIndex = XVar2 + 1;
      toFill->fBuffer[XVar2] = XVar4;
      XVar5 = value[1];
      value = value + 1;
    } while (XVar5 != L'\0');
  }
  return bVar6;
}

Assistant:

bool IGXMLScanner::normalizeAttRawValue( const   XMLCh* const        attrName
                                      , const XMLCh* const        value
                                      ,       XMLBuffer&          toFill)
{
    // Assume its going to go fine, and empty the target buffer in preperation
    bool retVal = true;
    toFill.reset();

    //  Loop through the chars of the source value and normalize it according
    //  to the type.
    bool escaped;
    XMLCh nextCh;
    const XMLCh* srcPtr = value;
    while (*srcPtr)
    {
        //  Get the next character from the source. We have to watch for
        //  escaped characters (which are indicated by a 0xFFFF value followed
        //  by the char that was escaped.)
        nextCh = *srcPtr;
        escaped = (nextCh == 0xFFFF);
        if (escaped)
            nextCh = *++srcPtr;

        //  If its not escaped, then make sure its not a < character, which is
        //  not allowed in attribute values.
        if (!escaped && (*srcPtr == chOpenAngle))
        {
            emitError(XMLErrs::BracketInAttrValue, attrName);
            retVal = false;
        }

        if (!escaped)
        {
            //  NOTE: Yes this is a little redundant in that a 0x20 is
            //  replaced with an 0x20. But its faster to do this (I think)
            //  than checking for 9, A, and D separately.
            if (fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                nextCh = chSpace;
        }

        // Add this char to the target buffer
        toFill.append(nextCh);

        // And move up to the next character in the source
        srcPtr++;
    }
    return retVal;
}